

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  uint uVar1;
  BPMNode **ppBVar2;
  BPMNode **ppBVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  ulong uVar10;
  BPMNode *pBVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar18 [32];
  undefined1 auVar17 [32];
  
  if (lists->numfree <= lists->nextfree) {
    uVar10 = (ulong)lists->memsize;
    if (uVar10 != 0) {
      pBVar11 = lists->memory;
      lVar12 = uVar10 - 1;
      auVar16._8_8_ = lVar12;
      auVar16._0_8_ = lVar12;
      auVar17._16_8_ = lVar12;
      auVar17._0_16_ = auVar16;
      auVar17._24_8_ = lVar12;
      auVar8 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      lVar12 = 0;
      auVar14._8_8_ = 0x8000000000000000;
      auVar14._0_8_ = 0x8000000000000000;
      auVar4 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
      auVar15._8_8_ = 0x8000000000000000;
      auVar15._0_8_ = 0x8000000000000000;
      auVar15._16_8_ = 0x8000000000000000;
      auVar15._24_8_ = 0x8000000000000000;
      auVar18._8_8_ = 8;
      auVar18._0_8_ = 8;
      auVar18._16_8_ = 8;
      auVar18._24_8_ = 8;
      do {
        auVar5 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar14,auVar16 ^ auVar14);
        auVar5 = vpackssdw_avx(auVar5,auVar5);
        auVar5 = vpackssdw_avx(auVar5 ^ auVar4,auVar5 ^ auVar4);
        if ((auVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar11->in_use + lVar12) = 0;
        }
        auVar5 = vpcmpgtq_avx(auVar9._0_16_ ^ auVar14,auVar16 ^ auVar14);
        auVar5 = vpackssdw_avx(auVar5,auVar5);
        auVar5 = vpackssdw_avx(auVar5 ^ auVar4,auVar5 ^ auVar4);
        if ((auVar5 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar11[1].in_use + lVar12) = 0;
        }
        auVar7 = vpcmpgtq_avx2(auVar9 ^ auVar15,auVar17 ^ auVar15);
        auVar6 = vpackssdw_avx2(auVar7,auVar8);
        auVar5 = auVar6._16_16_ ^ auVar4;
        auVar5 = vpackssdw_avx(auVar5,auVar5);
        if ((auVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar11[2].in_use + lVar12) = 0;
        }
        auVar6 = vpackssdw_avx2(auVar7,auVar8);
        auVar5 = auVar6._16_16_ ^ auVar4;
        auVar5 = vpackssdw_avx(auVar5,auVar5);
        if ((auVar5 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar11[3].in_use + lVar12) = 0;
        }
        auVar5 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar14,auVar16 ^ auVar14);
        auVar5 = vpackssdw_avx(auVar5,auVar5);
        auVar5 = vpackssdw_avx(auVar5 ^ auVar4,auVar5 ^ auVar4);
        if ((auVar5 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar11[4].in_use + lVar12) = 0;
        }
        auVar5 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar14,auVar16 ^ auVar14);
        auVar5 = vpackssdw_avx(auVar5,auVar5);
        auVar5 = vpackssdw_avx(auVar5 ^ auVar4,auVar5 ^ auVar4);
        if ((auVar5 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar11[5].in_use + lVar12) = 0;
        }
        auVar7 = vpcmpgtq_avx2(auVar8 ^ auVar15,auVar17 ^ auVar15);
        auVar6 = vpackssdw_avx2(auVar8,auVar7);
        auVar5 = auVar6._16_16_ ^ auVar4;
        auVar5 = vpackssdw_avx(auVar5,auVar5);
        if ((auVar5 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar11[6].in_use + lVar12) = 0;
        }
        auVar6 = vpshufhw_avx2(auVar7,0x84);
        auVar5 = auVar6._16_16_ ^ auVar4;
        auVar5 = vpackssdw_avx(auVar5,auVar5);
        if ((auVar5 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined4 *)((long)&pBVar11[7].in_use + lVar12) = 0;
        }
        auVar9 = vpaddq_avx2(auVar18,auVar9);
        auVar8 = vpaddq_avx2(auVar18,auVar8);
        lVar12 = lVar12 + 0xc0;
      } while ((uVar10 * 8 + 0x38 & 0xffffffffffffffc0) * 3 != lVar12);
    }
    uVar1 = lists->listsize;
    if ((ulong)uVar1 != 0) {
      ppBVar2 = lists->chains0;
      ppBVar3 = lists->chains1;
      uVar13 = 0;
      do {
        for (pBVar11 = ppBVar2[uVar13]; pBVar11 != (BPMNode *)0x0; pBVar11 = pBVar11->tail) {
          pBVar11->in_use = 1;
        }
        for (pBVar11 = ppBVar3[uVar13]; pBVar11 != (BPMNode *)0x0; pBVar11 = pBVar11->tail) {
          pBVar11->in_use = 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar1);
    }
    lists->numfree = 0;
    if (uVar10 != 0) {
      lVar12 = 0;
      do {
        if (*(int *)((long)&lists->memory->in_use + lVar12) == 0) {
          uVar1 = lists->numfree;
          lists->numfree = uVar1 + 1;
          lists->freelist[uVar1] = (BPMNode *)((long)&lists->memory->weight + lVar12);
        }
        lVar12 = lVar12 + 0x18;
      } while (uVar10 * 0x18 != lVar12);
    }
    lists->nextfree = 0;
  }
  uVar1 = lists->nextfree;
  lists->nextfree = uVar1 + 1;
  pBVar11 = lists->freelist[uVar1];
  pBVar11->weight = weight;
  pBVar11->index = index;
  pBVar11->tail = tail;
  return pBVar11;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
  unsigned i;
  BPMNode* result;

  /*memory full, so garbage collect*/
  if(lists->nextfree >= lists->numfree)
  {
    /*mark only those that are in use*/
    for(i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
    for(i = 0; i != lists->listsize; ++i)
    {
      BPMNode* node;
      for(node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
      for(node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
    }
    /*collect those that are free*/
    lists->numfree = 0;
    for(i = 0; i != lists->memsize; ++i)
    {
      if(!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
    }
    lists->nextfree = 0;
  }

  result = lists->freelist[lists->nextfree++];
  result->weight = weight;
  result->index = index;
  result->tail = tail;
  return result;
}